

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_app.cpp
# Opt level: O0

Error * __thiscall
ot::commissioner::CommissionerApp::GetBbrDataset
          (Error *__return_storage_ptr__,CommissionerApp *this,BbrDataset *aDataset,
          uint16_t aDatasetFlags)

{
  bool bVar1;
  element_type *peVar2;
  Error *aError;
  ErrorCode local_60 [4];
  Error local_50;
  undefined1 local_23;
  uint16_t local_22;
  BbrDataset *pBStack_20;
  uint16_t aDatasetFlags_local;
  BbrDataset *aDataset_local;
  CommissionerApp *this_local;
  Error *error;
  
  local_23 = 0;
  local_22 = aDatasetFlags;
  pBStack_20 = aDataset;
  aDataset_local = (BbrDataset *)this;
  this_local = (CommissionerApp *)__return_storage_ptr__;
  Error::Error(__return_storage_ptr__);
  peVar2 = std::
           __shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<ot::commissioner::Commissioner,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mCommissioner);
  (*peVar2->_vptr_Commissioner[0x18])(&local_50,peVar2,pBStack_20,(ulong)local_22);
  aError = Error::operator=(__return_storage_ptr__,&local_50);
  local_60[0] = kNone;
  bVar1 = commissioner::operator!=(aError,local_60);
  Error::~Error(&local_50);
  if (!bVar1) {
    MergeDataset(&this->mBbrDataset,pBStack_20);
  }
  return __return_storage_ptr__;
}

Assistant:

Error CommissionerApp::GetBbrDataset(BbrDataset &aDataset, uint16_t aDatasetFlags)
{
    Error error;

    SuccessOrExit(error = mCommissioner->GetBbrDataset(aDataset, aDatasetFlags));
    MergeDataset(mBbrDataset, aDataset);

exit:
    return error;
}